

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O0

void h265_read_sps_rbsp(h265_stream_t *h,bs_t *b)

{
  h265_sps_t *sps_00;
  uint32_t uVar1;
  uint32_t max_sub_layers_minus1;
  int iVar2;
  int iVar3;
  reference st_00;
  reference rps_00;
  uint32_t *puVar4;
  reference pvVar5;
  bool bVar6;
  uint local_350;
  int local_2f8;
  int sps_extension_data_flag;
  int i_2;
  int i_1;
  st_ref_pic_set_t *st;
  referencePictureSets_t *rps;
  int i;
  int sub_height_c;
  int sub_width_c;
  h265_sps_t *sps;
  undefined1 local_2b8 [8];
  profile_tier_level_t profile_tier_level;
  int sps_seq_parameter_set_id;
  int sps_temporal_id_nesting_flag;
  int sps_max_sub_layers_minus1;
  int sps_video_parameter_set_id;
  bs_t *b_local;
  h265_stream_t *h_local;
  
  profile_tier_level.sub_layer_level_idc.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  profile_tier_level.sub_layer_level_idc.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  profile_tier_level_t::profile_tier_level_t(local_2b8);
  uVar1 = bs_read_u(b,4);
  max_sub_layers_minus1 = bs_read_u(b,3);
  profile_tier_level.sub_layer_level_idc.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = bs_read_u1(b);
  memset((profile_tier_level_t *)local_2b8,0,0x290);
  h265_read_ptl((profile_tier_level_t *)local_2b8,b,1,max_sub_layers_minus1);
  profile_tier_level.sub_layer_level_idc.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = bs_read_ue(b);
  h->sps = h->sps_table
           [(int)(uint32_t)
                 profile_tier_level.sub_layer_level_idc.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage];
  sps_00 = h->sps;
  memset(sps_00,0,0x1ef8);
  sps_temporal_id_nesting_flag._0_1_ = (uint8_t)uVar1;
  sps_00->sps_video_parameter_set_id = (uint8_t)sps_temporal_id_nesting_flag;
  sps_seq_parameter_set_id._0_1_ = (uint8_t)max_sub_layers_minus1;
  sps_00->sps_max_sub_layers_minus1 = (uint8_t)sps_seq_parameter_set_id;
  sps_00->sps_temporal_id_nesting_flag =
       profile_tier_level.sub_layer_level_idc.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_1_;
  memcpy(&sps_00->ptl,local_2b8,0x290);
  sps_00->sps_seq_parameter_set_id =
       (uint32_t)
       profile_tier_level.sub_layer_level_idc.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  uVar1 = bs_read_ue(b);
  sps_00->chroma_format_idc = uVar1;
  h->info->chroma_format_idc = sps_00->chroma_format_idc;
  if (sps_00->chroma_format_idc == 3) {
    uVar1 = bs_read_u1(b);
    sps_00->separate_colour_plane_flag = (uint8_t)uVar1;
  }
  uVar1 = bs_read_ue(b);
  sps_00->pic_width_in_luma_samples = uVar1;
  uVar1 = bs_read_ue(b);
  sps_00->pic_height_in_luma_samples = uVar1;
  h->info->width = sps_00->pic_width_in_luma_samples;
  h->info->height = sps_00->pic_height_in_luma_samples;
  uVar1 = bs_read_u1(b);
  sps_00->conformance_window_flag = uVar1;
  if (sps_00->conformance_window_flag != 0) {
    uVar1 = bs_read_ue(b);
    sps_00->conf_win_left_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps_00->conf_win_right_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps_00->conf_win_top_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps_00->conf_win_bottom_offset = uVar1;
    h->info->crop_left = sps_00->conf_win_left_offset;
    h->info->crop_right = sps_00->conf_win_right_offset;
    h->info->crop_top = sps_00->conf_win_top_offset;
    h->info->crop_bottom = sps_00->conf_win_bottom_offset;
    if ((sps_00->chroma_format_idc == 1) || (bVar6 = false, sps_00->chroma_format_idc == 2)) {
      bVar6 = sps_00->separate_colour_plane_flag == '\0';
    }
    iVar3 = 1;
    if (bVar6) {
      iVar3 = 2;
    }
    bVar6 = false;
    if (sps_00->chroma_format_idc == 1) {
      bVar6 = sps_00->separate_colour_plane_flag == '\0';
    }
    iVar2 = 1;
    if (bVar6) {
      iVar2 = 2;
    }
    h->info->width =
         h->info->width -
         (iVar3 * sps_00->conf_win_right_offset + iVar3 * sps_00->conf_win_left_offset);
    h->info->height =
         h->info->height -
         (iVar2 * sps_00->conf_win_bottom_offset + iVar2 * sps_00->conf_win_top_offset);
  }
  uVar1 = bs_read_ue(b);
  sps_00->bit_depth_luma_minus8 = uVar1;
  uVar1 = bs_read_ue(b);
  sps_00->bit_depth_chroma_minus8 = uVar1;
  h->info->bit_depth_luma = sps_00->bit_depth_luma_minus8 + 8;
  h->info->bit_depth_chroma = sps_00->bit_depth_chroma_minus8 + 8;
  uVar1 = bs_read_ue(b);
  sps_00->log2_max_pic_order_cnt_lsb_minus4 = uVar1;
  uVar1 = bs_read_u1(b);
  sps_00->sps_sub_layer_ordering_info_present_flag = (uint8_t)uVar1;
  if (sps_00->sps_sub_layer_ordering_info_present_flag == '\0') {
    local_350 = (uint)sps_00->sps_max_sub_layers_minus1;
  }
  else {
    local_350 = 0;
  }
  for (rps._4_4_ = local_350; (int)rps._4_4_ <= (int)(uint)sps_00->sps_max_sub_layers_minus1;
      rps._4_4_ = rps._4_4_ + 1) {
    uVar1 = bs_read_ue(b);
    sps_00->sps_max_dec_pic_buffering_minus1[(int)rps._4_4_] = uVar1;
    uVar1 = bs_read_ue(b);
    sps_00->sps_max_num_reorder_pics[(int)rps._4_4_] = uVar1;
    uVar1 = bs_read_ue(b);
    sps_00->sps_max_latency_increase_plus1[(int)rps._4_4_] = uVar1;
  }
  uVar1 = bs_read_ue(b);
  sps_00->log2_min_luma_coding_block_size_minus3 = uVar1;
  uVar1 = bs_read_ue(b);
  sps_00->log2_diff_max_min_luma_coding_block_size = uVar1;
  uVar1 = bs_read_ue(b);
  sps_00->log2_min_luma_transform_block_size_minus2 = uVar1;
  uVar1 = bs_read_ue(b);
  sps_00->log2_diff_max_min_luma_transform_block_size = uVar1;
  uVar1 = bs_read_ue(b);
  sps_00->max_transform_hierarchy_depth_inter = uVar1;
  uVar1 = bs_read_ue(b);
  sps_00->max_transform_hierarchy_depth_intra = uVar1;
  uVar1 = bs_read_u1(b);
  sps_00->scaling_list_enabled_flag = (uint8_t)uVar1;
  if (sps_00->scaling_list_enabled_flag != '\0') {
    uVar1 = bs_read_u1(b);
    sps_00->sps_scaling_list_data_present_flag = uVar1;
    if (sps_00->sps_scaling_list_data_present_flag != 0) {
      h265_read_scaling_list(&sps_00->scaling_list_data,b);
    }
  }
  uVar1 = bs_read_u1(b);
  sps_00->amp_enabled_flag = (uint8_t)uVar1;
  uVar1 = bs_read_u1(b);
  sps_00->sample_adaptive_offset_enabled_flag = (uint8_t)uVar1;
  uVar1 = bs_read_u1(b);
  sps_00->pcm_enabled_flag = (uint8_t)uVar1;
  if (sps_00->pcm_enabled_flag != '\0') {
    uVar1 = bs_read_u(b,4);
    sps_00->pcm_sample_bit_depth_luma_minus1 = (uint8_t)uVar1;
    uVar1 = bs_read_u(b,4);
    sps_00->pcm_sample_bit_depth_chroma_minus1 = (uint8_t)uVar1;
    uVar1 = bs_read_ue(b);
    sps_00->log2_min_pcm_luma_coding_block_size_minus3 = uVar1;
    uVar1 = bs_read_ue(b);
    sps_00->log2_diff_max_min_pcm_luma_coding_block_size = uVar1;
    uVar1 = bs_read_u1(b);
    sps_00->pcm_loop_filter_disabled_flag = (uint8_t)uVar1;
  }
  uVar1 = bs_read_ue(b);
  sps_00->num_short_term_ref_pic_sets = uVar1;
  std::vector<st_ref_pic_set_t,_std::allocator<st_ref_pic_set_t>_>::resize
            (&sps_00->st_ref_pic_set,(long)sps_00->num_short_term_ref_pic_sets);
  std::vector<referencePictureSets_t,_std::allocator<referencePictureSets_t>_>::resize
            (&sps_00->m_RPSList,(long)sps_00->num_short_term_ref_pic_sets);
  for (sps_extension_data_flag = 0; sps_extension_data_flag < sps_00->num_short_term_ref_pic_sets;
      sps_extension_data_flag = sps_extension_data_flag + 1) {
    st_00 = std::vector<st_ref_pic_set_t,_std::allocator<st_ref_pic_set_t>_>::operator[]
                      (&sps_00->st_ref_pic_set,(long)sps_extension_data_flag);
    rps_00 = std::vector<referencePictureSets_t,_std::allocator<referencePictureSets_t>_>::
             operator[](&sps_00->m_RPSList,(long)sps_extension_data_flag);
    h265_read_short_term_ref_pic_set(b,sps_00,st_00,rps_00,sps_extension_data_flag);
  }
  uVar1 = bs_read_u1(b);
  sps_00->long_term_ref_pics_present_flag = (uint8_t)uVar1;
  if (sps_00->long_term_ref_pics_present_flag != '\0') {
    uVar1 = bs_read_ue(b);
    sps_00->num_long_term_ref_pics_sps = uVar1;
    std::vector<int,_std::allocator<int>_>::resize
              (&sps_00->lt_ref_pic_poc_lsb_sps,(long)sps_00->num_long_term_ref_pics_sps);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&sps_00->used_by_curr_pic_lt_sps_flag,(long)sps_00->num_long_term_ref_pics_sps);
    for (local_2f8 = 0; local_2f8 < sps_00->num_long_term_ref_pics_sps; local_2f8 = local_2f8 + 1) {
      sps_00->lt_ref_pic_poc_lsb_sps_bytes = sps_00->log2_max_pic_order_cnt_lsb_minus4 + 4;
      uVar1 = bs_read_u(b,sps_00->log2_max_pic_order_cnt_lsb_minus4 + 4);
      puVar4 = (uint32_t *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&sps_00->lt_ref_pic_poc_lsb_sps,(long)local_2f8);
      *puVar4 = uVar1;
      uVar1 = bs_read_u1(b);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&sps_00->used_by_curr_pic_lt_sps_flag,(long)local_2f8);
      *pvVar5 = (value_type)uVar1;
    }
  }
  uVar1 = bs_read_u1(b);
  sps_00->sps_temporal_mvp_enabled_flag = (uint8_t)uVar1;
  uVar1 = bs_read_u1(b);
  sps_00->strong_intra_smoothing_enabled_flag = (uint8_t)uVar1;
  uVar1 = bs_read_u1(b);
  sps_00->vui_parameters_present_flag = (uint8_t)uVar1;
  if ((sps_00->vui_parameters_present_flag != '\0') &&
     (h265_read_vui_parameters(&sps_00->vui,b,(uint)sps_00->sps_max_sub_layers_minus1),
     (sps_00->vui).vui_num_units_in_tick != 0)) {
    h->info->max_framerate =
         (float)(sps_00->vui).vui_time_scale / (float)(sps_00->vui).vui_num_units_in_tick;
  }
  uVar1 = bs_read_u1(b);
  sps_00->sps_extension_present_flag = (uint8_t)uVar1;
  if (sps_00->sps_extension_present_flag != '\0') {
    uVar1 = bs_read_u1(b);
    sps_00->sps_range_extension_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    sps_00->sps_multilayer_extension_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    sps_00->sps_3d_extension_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u(b,5);
    sps_00->sps_extension_5bits = (uint8_t)uVar1;
  }
  if (sps_00->sps_range_extension_flag != '\0') {
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).transform_skip_rotation_enabled_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).transform_skip_context_enabled_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).implicit_rdpcm_enabled_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).explicit_rdpcm_enabled_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).extended_precision_processing_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).intra_smoothing_disabled_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).high_precision_offsets_enabled_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).persistent_rice_adaptation_enabled_flag = (uint8_t)uVar1;
    uVar1 = bs_read_u1(b);
    (sps_00->sps_range_extension).cabac_bypass_alignment_enabled_flag = (uint8_t)uVar1;
  }
  if (sps_00->sps_multilayer_extension_flag != '\0') {
    uVar1 = bs_read_u1(b);
    sps_00->inter_view_mv_vert_constraint_flag = (uint8_t)uVar1;
  }
  if (sps_00->sps_extension_5bits != '\0') {
    while (iVar3 = h265_more_rbsp_trailing_data(b), iVar3 != 0) {
      bs_read_u1(b);
    }
  }
  h265_read_rbsp_trailing_bits(b);
  profile_tier_level_t::~profile_tier_level_t(local_2b8);
  return;
}

Assistant:

void  h265_read_sps_rbsp(h265_stream_t* h, bs_t* b)
{
    // NOTE 不能直接赋值给sps，因为还未知是哪一个sps。

    int sps_video_parameter_set_id = 0;
    int sps_max_sub_layers_minus1 = 0;
    int sps_temporal_id_nesting_flag = 0;
    int sps_seq_parameter_set_id = 0;
    profile_tier_level_t profile_tier_level;

    sps_video_parameter_set_id = bs_read_u(b, 4);
    sps_max_sub_layers_minus1 = bs_read_u(b, 3);
    sps_temporal_id_nesting_flag = bs_read_u1(b);

    // profile tier level...
    memset(&profile_tier_level, '\0', sizeof(profile_tier_level_t));

    h265_read_ptl(&profile_tier_level, b, 1, sps_max_sub_layers_minus1);

    sps_seq_parameter_set_id = bs_read_ue(b);
    // 选择正确的sps表
    h->sps = h->sps_table[sps_seq_parameter_set_id];
    h265_sps_t* sps = h->sps;
    memset(sps, 0, sizeof(h265_sps_t));

    sps->sps_video_parameter_set_id   = sps_video_parameter_set_id;
    sps->sps_max_sub_layers_minus1    = sps_max_sub_layers_minus1;
    sps->sps_temporal_id_nesting_flag = sps_temporal_id_nesting_flag;

    memcpy(&(sps->ptl), &profile_tier_level, sizeof(profile_tier_level_t)); // ptl

    sps->sps_seq_parameter_set_id     = sps_seq_parameter_set_id;
    sps->chroma_format_idc     = bs_read_ue(b);
    h->info->chroma_format_idc = sps->chroma_format_idc;
    if (sps->chroma_format_idc == 3)
    {
        sps->separate_colour_plane_flag = bs_read_u1(b);
    }
    sps->pic_width_in_luma_samples  = bs_read_ue(b);
    sps->pic_height_in_luma_samples = bs_read_ue(b);

    h->info->width  = sps->pic_width_in_luma_samples;
    h->info->height = sps->pic_height_in_luma_samples;

    sps->conformance_window_flag    = bs_read_u1(b);
    if (sps->conformance_window_flag)
    {
        sps->conf_win_left_offset   = bs_read_ue(b);
        sps->conf_win_right_offset  = bs_read_ue(b);
        sps->conf_win_top_offset    = bs_read_ue(b);
        sps->conf_win_bottom_offset = bs_read_ue(b);

        // calc width & height again...
        h->info->crop_left = sps->conf_win_left_offset;
        h->info->crop_right = sps->conf_win_right_offset;
        h->info->crop_top = sps->conf_win_top_offset;
        h->info->crop_bottom = sps->conf_win_bottom_offset;

        // 根据Table6-1及7.4.3.2.1重新计算宽、高
        // 注意：手册里加1，实际上不用
        // 参考：https://github.com/mbunkus/mkvtoolnix/issues/1152
        int sub_width_c  = ((1 == sps->chroma_format_idc) || (2 == sps->chroma_format_idc)) && (0 == sps->separate_colour_plane_flag) ? 2 : 1;
        int sub_height_c =  (1 == sps->chroma_format_idc)                                  && (0 == sps->separate_colour_plane_flag) ? 2 : 1;
        h->info->width  -= (sub_width_c*sps->conf_win_right_offset + sub_width_c*sps->conf_win_left_offset);
        h->info->height -= (sub_height_c*sps->conf_win_bottom_offset + sub_height_c*sps->conf_win_top_offset);
    }

    sps->bit_depth_luma_minus8   = bs_read_ue(b);
    sps->bit_depth_chroma_minus8 = bs_read_ue(b);

    // bit depth
    h->info->bit_depth_luma = sps->bit_depth_luma_minus8 + 8;
    h->info->bit_depth_chroma = sps->bit_depth_chroma_minus8 + 8;

    sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b);

    sps->sps_sub_layer_ordering_info_present_flag = bs_read_u1(b);
    for (int i = (sps->sps_sub_layer_ordering_info_present_flag ? 0 : sps->sps_max_sub_layers_minus1);
         i <= sps->sps_max_sub_layers_minus1; i++ )
    {
        sps->sps_max_dec_pic_buffering_minus1[i] = bs_read_ue(b);
        sps->sps_max_num_reorder_pics[i]         = bs_read_ue(b);
        sps->sps_max_latency_increase_plus1[i]   = bs_read_ue(b);
    }

    sps->log2_min_luma_coding_block_size_minus3      = bs_read_ue(b);
    sps->log2_diff_max_min_luma_coding_block_size    = bs_read_ue(b);
    sps->log2_min_luma_transform_block_size_minus2   = bs_read_ue(b);
    sps->log2_diff_max_min_luma_transform_block_size = bs_read_ue(b);
    sps->max_transform_hierarchy_depth_inter         = bs_read_ue(b);
    sps->max_transform_hierarchy_depth_intra         = bs_read_ue(b);

    sps->scaling_list_enabled_flag = bs_read_u1(b);
    if (sps->scaling_list_enabled_flag)
    {
        sps->sps_scaling_list_data_present_flag = bs_read_u1(b);
        if (sps->sps_scaling_list_data_present_flag)
        {
            // scaling_list_data()
            h265_read_scaling_list(&(sps->scaling_list_data), b);
        }
    }

    sps->amp_enabled_flag = bs_read_u1(b);
    sps->sample_adaptive_offset_enabled_flag = bs_read_u1(b);
    sps->pcm_enabled_flag = bs_read_u1(b);
    if (sps->pcm_enabled_flag)
    {
        sps->pcm_sample_bit_depth_luma_minus1   = bs_read_u(b, 4);
        sps->pcm_sample_bit_depth_chroma_minus1 = bs_read_u(b, 4);
        sps->log2_min_pcm_luma_coding_block_size_minus3   = bs_read_ue(b);
        sps->log2_diff_max_min_pcm_luma_coding_block_size = bs_read_ue(b);
        sps->pcm_loop_filter_disabled_flag      = bs_read_u1(b);
    }

    sps->num_short_term_ref_pic_sets = bs_read_ue(b);
    // 根据num_short_term_ref_pic_sets创建数组
    sps->st_ref_pic_set.resize(sps->num_short_term_ref_pic_sets);
    sps->m_RPSList.resize(sps->num_short_term_ref_pic_sets); // 确定一共有多少个RPS列表
    referencePictureSets_t* rps = NULL;
    st_ref_pic_set_t* st = NULL;
    for (int i = 0; i < sps->num_short_term_ref_pic_sets; i++)
    {
        st = &sps->st_ref_pic_set[i];
        rps = &sps->m_RPSList[i];
        h265_read_short_term_ref_pic_set(b, sps, st, rps, i);
    }

    sps->long_term_ref_pics_present_flag = bs_read_u1(b);
    if (sps->long_term_ref_pics_present_flag)
    {
        sps->num_long_term_ref_pics_sps = bs_read_ue(b);
        sps->lt_ref_pic_poc_lsb_sps.resize(sps->num_long_term_ref_pics_sps);
        sps->used_by_curr_pic_lt_sps_flag.resize(sps->num_long_term_ref_pics_sps);
        for (int i = 0; i < sps->num_long_term_ref_pics_sps; i++)
        {
            sps->lt_ref_pic_poc_lsb_sps_bytes = sps->log2_max_pic_order_cnt_lsb_minus4 + 4;
            sps->lt_ref_pic_poc_lsb_sps[i] = bs_read_u(b, sps->log2_max_pic_order_cnt_lsb_minus4 + 4); // u(v)
            sps->used_by_curr_pic_lt_sps_flag[i] = bs_read_u1(b);
        }
    }

    sps->sps_temporal_mvp_enabled_flag = bs_read_u1(b);
    sps->strong_intra_smoothing_enabled_flag = bs_read_u1(b);
    sps->vui_parameters_present_flag = bs_read_u1(b);
    if (sps->vui_parameters_present_flag)
    {
        h265_read_vui_parameters(&(sps->vui), b, sps->sps_max_sub_layers_minus1);
        // calc fps
        if (sps->vui.vui_num_units_in_tick != 0)
            h->info->max_framerate = (float)(sps->vui.vui_time_scale) / (float)(sps->vui.vui_num_units_in_tick);
    }

    sps->sps_extension_present_flag = bs_read_u1(b);
    if (sps->sps_extension_present_flag)
    {
        sps->sps_range_extension_flag      = bs_read_u1(b);
        sps->sps_multilayer_extension_flag = bs_read_u1(b);
        sps->sps_3d_extension_flag         = bs_read_u1(b);
        sps->sps_extension_5bits           = bs_read_u(b, 5);
    }

    if (sps->sps_range_extension_flag)
    {
        sps->sps_range_extension.transform_skip_rotation_enabled_flag    = bs_read_u1(b);
        sps->sps_range_extension.transform_skip_context_enabled_flag     = bs_read_u1(b);
        sps->sps_range_extension.implicit_rdpcm_enabled_flag             = bs_read_u1(b);
        sps->sps_range_extension.explicit_rdpcm_enabled_flag             = bs_read_u1(b);
        sps->sps_range_extension.extended_precision_processing_flag      = bs_read_u1(b);
        sps->sps_range_extension.intra_smoothing_disabled_flag           = bs_read_u1(b);
        sps->sps_range_extension.high_precision_offsets_enabled_flag     = bs_read_u1(b);
        sps->sps_range_extension.persistent_rice_adaptation_enabled_flag = bs_read_u1(b);
        sps->sps_range_extension.cabac_bypass_alignment_enabled_flag     = bs_read_u1(b);
    }
    if (sps->sps_multilayer_extension_flag)
    {
        // sps_multilayer_extension()
        sps->inter_view_mv_vert_constraint_flag = bs_read_u1(b);
    }
    if (sps->sps_3d_extension_flag)
    {
        // todo sps_3d_extension( )
    }
    if (sps->sps_extension_5bits)
    {
        while (h265_more_rbsp_trailing_data(b))
        {
            int sps_extension_data_flag = bs_read_u1(b);
        }
    }
    h265_read_rbsp_trailing_bits(b);
}